

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearConstraint.cpp
# Opt level: O3

void __thiscall
iDynTree::optimalcontrol::LinearConstraint::LinearConstraint
          (LinearConstraint *this,size_t size,string *name,SparsityStructure *stateSparsity,
          SparsityStructure *controlSparsity)

{
  pointer pcVar1;
  bool bVar2;
  LinearConstraintImplementation *pLVar3;
  string local_50;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + name->_M_string_length);
  Constraint::Constraint(&this->super_Constraint,size,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  (this->super_Constraint)._vptr_Constraint = (_func_int **)&PTR__LinearConstraint_0019a1d0;
  pLVar3 = (LinearConstraintImplementation *)operator_new(0x140);
  LinearConstraintImplementation::LinearConstraintImplementation(pLVar3,size);
  this->m_pimpl = pLVar3;
  bVar2 = SparsityStructure::isValid(stateSparsity);
  if (bVar2) {
    pLVar3 = this->m_pimpl;
    pLVar3->hasStateSparsity = true;
    if (&pLVar3->stateSparsity != stateSparsity) {
      std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&pLVar3->stateSparsity,
                 (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  *)stateSparsity);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              (&(pLVar3->stateSparsity).m_nonZeroElementRows,&stateSparsity->m_nonZeroElementRows);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              (&(pLVar3->stateSparsity).m_nonZeroElementColumns,
               &stateSparsity->m_nonZeroElementColumns);
  }
  bVar2 = SparsityStructure::isValid(controlSparsity);
  if (bVar2) {
    pLVar3 = this->m_pimpl;
    pLVar3->hasControlSparsity = true;
    if (&pLVar3->controlSparsity != controlSparsity) {
      std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&pLVar3->controlSparsity,
                 (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  *)controlSparsity);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              (&(pLVar3->controlSparsity).m_nonZeroElementRows,
               &controlSparsity->m_nonZeroElementRows);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              (&(pLVar3->controlSparsity).m_nonZeroElementColumns,
               &controlSparsity->m_nonZeroElementColumns);
  }
  return;
}

Assistant:

LinearConstraint::LinearConstraint(size_t size, const std::string name, const SparsityStructure &stateSparsity, const SparsityStructure &controlSparsity)
            : Constraint(size, name)
            , m_pimpl(new LinearConstraintImplementation(size))
        {
            if (stateSparsity.isValid()) {
                m_pimpl->hasStateSparsity = true;
                m_pimpl->stateSparsity = stateSparsity;
            }
            if (controlSparsity.isValid()) {
                m_pimpl->hasControlSparsity = true;
                m_pimpl->controlSparsity = controlSparsity;
            }
        }